

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O1

TLVWriter * __thiscall ASDCP::MXF::TLVWriter::WriteUi8(TLVWriter *this,MDDEntry *Entry,ui8_t *value)

{
  uint uVar1;
  int iVar2;
  undefined1 *in_RCX;
  Result_t result;
  TLVWriter local_88;
  
  if (in_RCX == (undefined1 *)0x0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
    return this;
  }
  WriteTag(&local_88,Entry);
  if (-1 < (int)local_88.super_MemIOWriter.m_p) {
    if ((ulong)*(uint *)(Entry->ul + 8) < (ulong)*(uint *)(Entry->ul + 0xc) + 2) {
      Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
      goto LAB_001a3ac6;
    }
    *(undefined2 *)(*(long *)Entry->ul + (ulong)*(uint *)(Entry->ul + 0xc)) = 0x100;
    iVar2 = *(int *)(Entry->ul + 0xc);
    uVar1 = iVar2 + 2;
    *(uint *)(Entry->ul + 0xc) = uVar1;
    if (*(uint *)(Entry->ul + 8) < iVar2 + 3U) {
      Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
      goto LAB_001a3ac6;
    }
    *(undefined1 *)(*(long *)Entry->ul + (ulong)uVar1) = *in_RCX;
    *(int *)(Entry->ul + 0xc) = *(int *)(Entry->ul + 0xc) + 1;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)&local_88);
LAB_001a3ac6:
  Kumu::Result_t::~Result_t((Result_t *)&local_88);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::TLVWriter::WriteUi8(const MDDEntry& Entry, ui8_t* value)
{
  ASDCP_TEST_NULL(value);
  Result_t result = WriteTag(Entry);

  if ( ASDCP_SUCCESS(result) )
    {
      if ( ! MemIOWriter::WriteUi16BE(sizeof(ui8_t)) ) return RESULT_KLV_CODING(__LINE__, __FILE__);
      if ( ! MemIOWriter::WriteUi8(*value) ) return RESULT_KLV_CODING(__LINE__, __FILE__);
    }
  
  return result;
}